

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

void __thiscall TokenScanner::addOperator(TokenScanner *this,string *op)

{
  StringCell *this_00;
  StringCell *cp;
  string *op_local;
  TokenScanner *this_local;
  
  this_00 = (StringCell *)operator_new(0x28);
  StringCell::StringCell(this_00);
  std::__cxx11::string::operator=((string *)this_00,(string *)op);
  this_00->link = this->operators;
  this->operators = this_00;
  return;
}

Assistant:

void TokenScanner::addOperator(string op) {
   StringCell *cp = new StringCell;
   cp->str = op;
   cp->link = operators;
   operators = cp;
}